

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulative.cpp
# Opt level: O0

void __thiscall CumulativeProp::printStats(CumulativeProp *this)

{
  ulong uVar1;
  ostream *poVar2;
  long in_RDI;
  
  fprintf(_stderr,"%% Cumulative propagator statistics");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr," for ");
    std::operator<<(poVar2,(string *)(in_RDI + 0x18));
  }
  fprintf(_stderr,":\n");
  fprintf(_stderr,"%%\t#TT incons.: %ld\n",*(undefined8 *)(in_RDI + 0x80));
  if ((*(byte *)(in_RDI + 0x72) & 1) != 0) {
    fprintf(_stderr,"%%\t#TT prop.: %ld\n",*(undefined8 *)(in_RDI + 0x88));
  }
  if (((*(byte *)(in_RDI + 0x73) & 1) != 0) || ((*(byte *)(in_RDI + 0x74) & 1) != 0)) {
    fprintf(_stderr,"%%\t#TTEF incons.: %ld\n",*(undefined8 *)(in_RDI + 0x90));
  }
  if ((*(byte *)(in_RDI + 0x74) & 1) != 0) {
    fprintf(_stderr,"%%\t#TTEF prop.: %ld\n",*(undefined8 *)(in_RDI + 0x98));
  }
  return;
}

Assistant:

void printStats() override {
		fprintf(stderr, "%% Cumulative propagator statistics");
		if (!name.empty()) {
			std::cerr << " for " << name;
		}
		fprintf(stderr, ":\n");
		fprintf(stderr, "%%\t#TT incons.: %ld\n", nb_tt_incons);
		if (tt_filt) {
			fprintf(stderr, "%%\t#TT prop.: %ld\n", nb_tt_filt);
		}
		if (ttef_check || ttef_filt) {
			fprintf(stderr, "%%\t#TTEF incons.: %ld\n", nb_ttef_incons);
		}
		if (ttef_filt) {
			fprintf(stderr, "%%\t#TTEF prop.: %ld\n", nb_ttef_filt);
		}
	}